

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::UnionInPlace
          (CharSetInner *this,ArenaAllocator *allocator,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  CharSetNode *pCVar6;
  undefined4 extraout_var;
  long lVar7;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f8,"(level > 0)","level > 0");
    if (!bVar3) goto LAB_00e6d917;
    *puVar5 = 0;
  }
  if ((other == (CharSetNode *)&CharSetFull::Instance || other == (CharSetNode *)0x0) ||
     (iVar4 = (*other->_vptr_CharSetNode[0xd])(other), (char)iVar4 != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1f9,
                       "(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf())"
                       ,"other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf()")
    ;
    if (!bVar3) {
LAB_00e6d917:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = true;
  bVar3 = true;
  lVar7 = 1;
  do {
    if (other[lVar7]._vptr_CharSetNode == (_func_int **)0x0) {
      pCVar6 = this->children[lVar7 + -1];
LAB_00e6d8c0:
      bVar3 = bVar2;
      if (pCVar6 != (CharSetNode *)&CharSetFull::Instance) {
        bVar3 = false;
        bVar2 = bVar3;
      }
    }
    else {
      if (other[lVar7]._vptr_CharSetNode != (_func_int **)&CharSetFull::Instance) {
        if (this->children[lVar7 + -1] == (CharSetNode *)0x0) {
          pCVar6 = CharSetNode::For(allocator,level - 1);
          this->children[lVar7 + -1] = pCVar6;
        }
        iVar4 = (*this->children[lVar7 + -1]->_vptr_CharSetNode[4])
                          (this->children[lVar7 + -1],allocator,(ulong)(level - 1),
                           other[lVar7]._vptr_CharSetNode);
        pCVar6 = (CharSetNode *)CONCAT44(extraout_var,iVar4);
        this->children[lVar7 + -1] = pCVar6;
        goto LAB_00e6d8c0;
      }
      pCVar6 = this->children[lVar7 + -1];
      if (pCVar6 != (CharSetNode *)0x0) {
        (**pCVar6->_vptr_CharSetNode)(pCVar6,allocator);
      }
      this->children[lVar7 + -1] = (CharSetNode *)&CharSetFull::Instance;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x11) {
      if (bVar3) {
        FreeSelf(this,allocator);
        this = (CharSetInner *)&CharSetFull::Instance;
      }
      return &this->super_CharSetNode;
    }
  } while( true );
}

Assistant:

CharSetNode* CharSetInner::UnionInPlace(ArenaAllocator* allocator, uint level, const CharSetNode* other)
    {
        Assert(level > 0);
        Assert(other != nullptr && other != CharSetFull::TheFullNode && !other->IsLeaf());
        CharSetInner* otherInner = (CharSetInner*)other;
        level--;
        bool isFull = true;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (otherInner->children[i] != nullptr)
            {
                if (otherInner->children[i] == CharSetFull::TheFullNode)
                {
                    if (children[i] != nullptr)
                        children[i]->FreeSelf(allocator);
                    children[i] = CharSetFull::TheFullNode;
                }
                else
                {
                    if (children[i] == nullptr)
                        children[i] = For(allocator, level);
                    children[i] = children[i]->UnionInPlace(allocator, level, otherInner->children[i]);
                    if (children[i] != CharSetFull::TheFullNode)
                        isFull = false;
                }
            }
            else if (children[i] != CharSetFull::TheFullNode)
                isFull = false;
        }
        if (isFull)
        {
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }